

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

Type * __thiscall
soul::AST::EndpointDetails::getElementDataType
          (Type *__return_storage_ptr__,EndpointDetails *this,Expression *e)

{
  int iVar1;
  undefined8 uVar2;
  Structure *pSVar3;
  pointer pTVar4;
  bool bVar5;
  Primitive local_58;
  undefined4 local_54;
  vector<soul::Type,_std::allocator<soul::Type>_> local_48;
  
  getResolvedDataTypes(&local_48,this);
  local_54._0_1_ = __return_storage_ptr__->category;
  local_54._1_1_ = __return_storage_ptr__->arrayElementCategory;
  local_54._2_1_ = __return_storage_ptr__->isRef;
  local_54._3_1_ = __return_storage_ptr__->isConstant;
  bVar5 = local_48.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_48.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
          super__Vector_impl_data._M_finish;
  if (!bVar5) {
    local_58 = (__return_storage_ptr__->primitiveType).type;
    uVar2._0_4_ = __return_storage_ptr__->boundingSize;
    uVar2._4_4_ = __return_storage_ptr__->arrayElementBoundingSize;
    pSVar3 = (__return_storage_ptr__->structure).object;
    pTVar4 = local_48.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      iVar1 = (*(e->super_Statement).super_ASTObject._vptr_ASTObject[0x10])(e,pTVar4);
      if ((char)iVar1 != '\0') {
        local_54._0_1_ = pTVar4->category;
        local_54._1_1_ = pTVar4->arrayElementCategory;
        local_54._2_1_ = pTVar4->isRef;
        local_54._3_1_ = pTVar4->isConstant;
        local_58 = (pTVar4->primitiveType).type;
        uVar2._0_4_ = pTVar4->boundingSize;
        uVar2._4_4_ = pTVar4->arrayElementBoundingSize;
        pSVar3 = (pTVar4->structure).object;
        if (pSVar3 != (Structure *)0x0) {
          (pSVar3->super_RefCountedObject).refCount = (pSVar3->super_RefCountedObject).refCount + 1;
        }
        if ((char)iVar1 != '\0') {
          (__return_storage_ptr__->primitiveType).type = local_58;
          __return_storage_ptr__->boundingSize = (undefined4)uVar2;
          __return_storage_ptr__->arrayElementBoundingSize = uVar2._4_4_;
          (__return_storage_ptr__->structure).object = pSVar3;
          __return_storage_ptr__->category = (undefined1)local_54;
          __return_storage_ptr__->arrayElementCategory = local_54._1_1_;
          __return_storage_ptr__->isRef = (bool)local_54._2_1_;
          __return_storage_ptr__->isConstant = (bool)local_54._3_1_;
          std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_48);
          if (!bVar5) {
            return __return_storage_ptr__;
          }
          goto LAB_0022aa5a;
        }
      }
      pTVar4 = pTVar4 + 1;
      bVar5 = pTVar4 == local_48.super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl
                        .super__Vector_impl_data._M_finish;
    } while (!bVar5);
    (__return_storage_ptr__->primitiveType).type = local_58;
    __return_storage_ptr__->boundingSize = (int)uVar2;
    __return_storage_ptr__->arrayElementBoundingSize = (int)((ulong)uVar2 >> 0x20);
    (__return_storage_ptr__->structure).object = pSVar3;
  }
  __return_storage_ptr__->category = (undefined1)local_54;
  __return_storage_ptr__->arrayElementCategory = local_54._1_1_;
  __return_storage_ptr__->isRef = (bool)local_54._2_1_;
  __return_storage_ptr__->isConstant = (bool)local_54._3_1_;
  std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_48);
LAB_0022aa5a:
  throwInternalCompilerError("getElementDataType",0x41e);
}

Assistant:

Type getElementDataType (Expression& e) const
        {
            for (auto& type : getResolvedDataTypes())
                if (e.canSilentlyCastTo (type))
                    return type;

            SOUL_ASSERT_FALSE;
            return {};
        }